

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  word *pInit;
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  int *__ptr;
  Dec_Graph_t *pGraph;
  Bdc_Man_t *p_00;
  Kit_DsdNtk_t *pNtk;
  byte bVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  word *pwVar16;
  ulong uVar17;
  uint uVar18;
  timespec ts;
  char *in_stack_fffffffffffff7d8;
  timespec local_808 [125];
  
  iVar2 = clock_gettime(3,local_808);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec)),8)
    ;
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) +
            CONCAT44(local_808[0].tv_sec._4_4_,(int)local_808[0].tv_sec) * -1000000;
  }
  if (DecType == 1) {
    pcVar14 = "factoring";
LAB_0025ba7e:
    pcVar5 = "s";
    if (p->nFuncs == 1) {
      pcVar5 = "";
    }
    printf("Applying %-10s to %8d func%s of %2d vars...  ",pcVar14,(ulong)(uint)p->nFuncs,pcVar5);
  }
  else if (DecType - 2U < 4) {
    pcVar14 = &DAT_008768e0 + *(int *)(&DAT_008768e0 + (ulong)(DecType - 2U) * 4);
    goto LAB_0025ba7e;
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (DecType == 1) {
    vStr = (Vec_Str_t *)malloc(0x10);
    vStr->nCap = 10000;
    vStr->nSize = 0;
    pcVar14 = (char *)malloc(10000);
    vStr->pArray = pcVar14;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    __ptr = (int *)malloc(0x40000);
    vCover->pArray = __ptr;
    if (p->nFuncs < 1) {
      uVar18 = 0;
    }
    else {
      uVar9 = 0;
      uVar18 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar9 & 0xffffffff);
        }
        pcVar14 = Kit_PlaFromTruthNew((uint *)p->pFuncs[uVar9],p->nVars,vCover,vStr);
        pGraph = Dec_Factor(pcVar14);
        uVar18 = (uVar18 - pGraph->nLeaves) + pGraph->nSize;
        if (fVerbose != 0) {
          Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
        }
        if (pGraph->pNodes != (Dec_Node_t *)0x0) {
          free(pGraph->pNodes);
        }
        free(pGraph);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)p->nFuncs);
      __ptr = vCover->pArray;
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(vCover);
    if (vStr->pArray != (char *)0x0) {
      free(vStr->pArray);
    }
    free(vStr);
  }
  else {
    switch(DecType) {
    case 2:
      local_808[0].tv_sec._4_4_ = 0;
      local_808[0].tv_nsec._0_4_ = 0;
      local_808[0].tv_sec._0_4_ = p->nVars;
      p_00 = Bdc_ManAlloc((Bdc_Par_t *)local_808);
      if (p->nFuncs < 1) {
        uVar18 = 0;
      }
      else {
        uVar9 = 0;
        uVar18 = 0;
        do {
          if (fVerbose != 0) {
            printf("%7d :      ",uVar9 & 0xffffffff);
          }
          Bdc_ManDecompose(p_00,(uint *)p->pFuncs[uVar9],(uint *)0x0,p->nVars,(Vec_Ptr_t *)0x0,1000)
          ;
          iVar2 = Bdc_ManAndNum(p_00);
          if (fVerbose != 0) {
            Bdc_ManDecPrint(p_00);
          }
          uVar18 = uVar18 + iVar2;
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)p->nFuncs);
      }
      Bdc_ManFree(p_00);
      goto LAB_0025bf29;
    case 3:
      if (0 < p->nFuncs) {
        uVar9 = 0;
        uVar18 = 0;
        do {
          if (fVerbose != 0) {
            printf("%7d :      ",uVar9 & 0xffffffff);
          }
          pNtk = Kit_DsdDecomposeMux((uint *)p->pFuncs[uVar9],p->nVars,3);
          if (fVerbose != 0) {
            Kit_DsdPrintExpanded(pNtk);
            putchar(10);
          }
          iVar2 = Kit_DsdCountAigNodes(pNtk);
          uVar18 = uVar18 + iVar2;
          Kit_DsdNtkFree(pNtk);
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)p->nFuncs);
        goto LAB_0025bf29;
      }
      break;
    case 4:
      if (0 < p->nFuncs) {
        uVar9 = 0;
        uVar18 = 0;
        do {
          if (fVerbose == 0) {
            Dau_DsdDecompose(p->pFuncs[uVar9],p->nVars,0,1,(char *)local_808);
          }
          else {
            printf("%7d :      ",uVar9 & 0xffffffff);
            Dau_DsdDecompose(p->pFuncs[uVar9],p->nVars,0,1,(char *)local_808);
            puts((char *)local_808);
          }
          iVar2 = Dau_DsdCountAnds(in_stack_fffffffffffff7d8);
          uVar18 = uVar18 + iVar2;
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)p->nFuncs);
        goto LAB_0025bf29;
      }
      break;
    case 5:
      if (0 < p->nFuncs) {
        uVar9 = 0;
        do {
          pInit = p->pFuncs[uVar9];
          uVar18 = p->nVars;
          iVar2 = 0;
          if (0 < (long)(int)uVar18) {
            iVar3 = uVar18 - 6;
            uVar6 = 1 << ((byte)iVar3 & 0x1f);
            uVar1 = uVar6;
            if ((int)uVar6 < 2) {
              uVar1 = 1;
            }
            uVar8 = 0;
            iVar2 = 0;
            do {
              if (uVar18 < 7) {
                if ((s_Truths6Neg[uVar8] &
                    (*pInit >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^ *pInit)) != 0) {
LAB_0025bd91:
                  iVar2 = iVar2 + 1;
                }
              }
              else if (uVar8 < 6) {
                if (iVar3 != 0x1f) {
                  uVar17 = 0;
                  do {
                    if (((pInit[uVar17] >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x3f) ^
                         pInit[uVar17]) & s_Truths6Neg[uVar8]) != 0) goto LAB_0025bd91;
                    uVar17 = uVar17 + 1;
                  } while (uVar1 != uVar17);
                }
              }
              else if (iVar3 != 0x1f) {
                bVar4 = (byte)(uVar8 - 6);
                uVar13 = 1 << (bVar4 & 0x1f);
                iVar15 = 2 << (bVar4 & 0x1f);
                uVar17 = 1;
                if (1 < (int)uVar13) {
                  uVar17 = (ulong)uVar13;
                }
                pwVar10 = pInit + (int)uVar13;
                pwVar16 = pInit;
                do {
                  if (uVar8 - 6 != 0x1f) {
                    uVar12 = 0;
                    do {
                      if (pwVar16[uVar12] != pwVar10[uVar12]) goto LAB_0025bd91;
                      uVar12 = uVar12 + 1;
                    } while (uVar17 != uVar12);
                  }
                  pwVar16 = pwVar16 + iVar15;
                  pwVar10 = pwVar10 + iVar15;
                } while (pwVar16 < pInit + (int)uVar6);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != (long)(int)uVar18);
          }
          if (fVerbose == 0) {
            Dau_DecTrySets(pInit,iVar2,0);
          }
          else {
            printf("%7d :      ",uVar9 & 0xffffffff);
            Dau_DecTrySets(p->pFuncs[uVar9],iVar2,fVerbose);
            putchar(10);
          }
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)p->nFuncs);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDec.c"
                    ,0x245,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
    }
    uVar18 = 0;
  }
LAB_0025bf29:
  printf("AIG nodes =%9d  ",(ulong)uVar18);
  iVar2 = clock_gettime(3,local_808);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec) / 1000 +
             CONCAT44(local_808[0].tv_sec._4_4_,(int)local_808[0].tv_sec) * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar11 + lVar7) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}